

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O2

string * __thiscall
Hpipe::CharItem::compact_repr_abi_cxx11_(string *__return_storage_ptr__,CharItem *this)

{
  pointer pcVar1;
  mapped_type mVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  CharItem *local_20;
  
  if ((compact_repr[abi:cxx11]()::d == '\0') &&
     (iVar3 = __cxa_guard_acquire(&compact_repr[abi:cxx11]()::d), iVar3 != 0)) {
    compact_repr::d._M_h._M_buckets = &compact_repr::d._M_h._M_single_bucket;
    compact_repr::d._M_h._M_bucket_count = 1;
    compact_repr::d._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    compact_repr::d._M_h._M_element_count = 0;
    compact_repr::d._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    compact_repr::d._M_h._M_rehash_policy._M_next_resize = 0;
    compact_repr::d._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __cxa_atexit(std::
                 unordered_map<const_Hpipe::CharItem_*,_unsigned_int,_std::hash<const_Hpipe::CharItem_*>,_std::equal_to<const_Hpipe::CharItem_*>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>_>
                 ::~unordered_map,&compact_repr::d,&__dso_handle);
    __cxa_guard_release(&compact_repr[abi:cxx11]()::d);
  }
  local_20 = this;
  sVar4 = std::
          _Hashtable<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&compact_repr::d._M_h,&local_20);
  if (sVar4 == 0) {
    mVar2 = (mapped_type)compact_repr::d._M_h._M_element_count;
    local_20 = this;
    pmVar5 = std::__detail::
             _Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&compact_repr::d,&local_20);
    *pmVar5 = mVar2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20 = this;
  pmVar5 = std::__detail::
           _Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&compact_repr::d,&local_20);
  mVar2 = *pmVar5;
  if (mVar2 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,'0');
  }
  else {
    for (; mVar2 != 0; mVar2 = mVar2 / 0x1a) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CharItem::compact_repr() const {
    static std::unordered_map<const CharItem *,unsigned> d;
    if ( not d.count( this ) )
        d[ this ] = d.size();
    std::string res;
    unsigned c = d[ this ];
    if ( not c )
        res = '0';
    else {
        while ( c ) {
            res += 'a' + c % 26;
            c /= 26;
        }
        std::reverse( res.begin(), res.end() );
    }
    return res;
}